

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O3

int __thiscall QualEngine::init(QualEngine *this,EVP_PKEY_CTX *ctx)

{
  pointer ppNVar1;
  Tank *this_00;
  int in_EAX;
  int iVar2;
  Tank *tank;
  pointer ppNVar3;
  double dVar4;
  
  if (this->engineState == OPENED) {
    ppNVar1 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar3 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppNVar3 != ppNVar1;
        ppNVar3 = ppNVar3 + 1) {
      this_00 = (Tank *)*ppNVar3;
      dVar4 = 0.0;
      if (this->network->qualModel->type != 2) {
        dVar4 = (this_00->super_Node).initQual;
      }
      (this_00->super_Node).quality = dVar4;
      iVar2 = (*(this_00->super_Node).super_Element._vptr_Element[2])(this_00);
      if (iVar2 == 1) {
        dVar4 = Tank::findVolume(this_00,this_00->initHead);
        this_00->volume = dVar4;
      }
    }
    (*this->qualSolver->_vptr_QualSolver[2])();
    (*this->network->qualModel->_vptr_QualModel[3])();
    in_EAX = (this->network->options).timeOptions[2];
    iVar2 = 300;
    if (0 < in_EAX) {
      iVar2 = in_EAX;
    }
    this->qualStep = iVar2;
    this->qualTime = 0;
    this->engineState = INITIALIZED;
  }
  return in_EAX;
}

Assistant:

void QualEngine::init()
{
    if (engineState != QualEngine::OPENED) return;

    // ... initialize node concentrations & tank volumes

    for (Node* node : network->nodes)
    {
        if ( network->qualModel->type == QualModel::TRACE ) node->quality = 0.0;
        else node->quality = node->initQual;
        if ( node->type() == Node::TANK )
        {
            Tank* tank = static_cast<Tank*>(node);
            tank->volume = tank->findVolume(tank->initHead);
        }
    }

    // ... initialize reaction model and quality solver

    qualSolver->init();
    network->qualModel->init(network);
    qualStep = network->option(Options::QUAL_STEP);
    if ( qualStep <= 0 ) qualStep = 300;
    qualTime = 0;
    engineState = QualEngine::INITIALIZED;
}